

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PipelineResourceSignatureBase.hpp
# Opt level: O2

void __thiscall
Diligent::PipelineResourceSignatureBase<Diligent::EngineVkImplTraits>::Initialize
          (PipelineResourceSignatureBase<Diligent::EngineVkImplTraits> *this,
          IMemoryAllocator *RawAllocator,PipelineResourceSignatureDesc *Desc,
          bool CreateImmutableSamplers,function<void_()> *InitResourceLayout,
          function<unsigned_long_()> *GetRequiredResourceCacheMemorySize,
          AllocResourceAttribsCallbackType *AllocResourceAttribs,
          AllocImmutableSamplerAttribsCallbackType *AllocImmutableSampler)

{
  array<unsigned_short,_4UL> *ResourceOffsets;
  char cVar1;
  ushort uVar2;
  SHADER_TYPE SVar3;
  PipelineResourceAttribsVk *pPVar4;
  ShaderVariableManagerVk *pSVar5;
  ImmutableSamplerAttribsVk *pIVar6;
  RefCntAutoPtr<Diligent::SamplerVkImpl> *pRVar7;
  RenderDeviceVkImpl *pRVar8;
  pointer pcVar9;
  uint uVar10;
  PipelineResourceSignatureBase<Diligent::EngineVkImplTraits> *args_1;
  ulong uVar11;
  Uint32 s;
  ulong uVar12;
  long lVar13;
  Uint32 i;
  ulong uVar14;
  long lVar15;
  long *plVar16;
  Uint32 s_1;
  SHADER_RESOURCE_VARIABLE_TYPE AllowedVarTypes [1];
  undefined6 uStack_f6;
  string msg;
  FixedLinearAllocator Allocator;
  
  Allocator.m_ReservedSize = 0;
  Allocator.m_CurrAlignment = 0;
  Allocator.m_pDataStart = (uint8_t *)0x0;
  Allocator.m_pCurrPtr = (uint8_t *)0x0;
  Allocator.m_DbgCurrAllocation = 0;
  Allocator.m_DbgAllocations.
  super__Vector_base<Diligent::FixedLinearAllocator::DbgAllocationInfo,_std::allocator<Diligent::FixedLinearAllocator::DbgAllocationInfo>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  Allocator.m_DbgAllocations.
  super__Vector_base<Diligent::FixedLinearAllocator::DbgAllocationInfo,_std::allocator<Diligent::FixedLinearAllocator::DbgAllocationInfo>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  Allocator.m_DbgAllocations.
  super__Vector_base<Diligent::FixedLinearAllocator::DbgAllocationInfo,_std::allocator<Diligent::FixedLinearAllocator::DbgAllocationInfo>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  Allocator.m_DbgUsingExternalMemory = false;
  Allocator.m_pAllocator = RawAllocator;
  ReserveSpaceForPipelineResourceSignatureDesc(&Allocator,Desc);
  FixedLinearAllocator::AddSpace<Diligent::PipelineResourceAttribsVk>
            (&Allocator,(ulong)Desc->NumResources);
  SVar3 = this->m_StaticResShaderStages;
  uVar10 = SVar3 - (SVar3 >> 1 & 0x55555555);
  uVar10 = (uVar10 >> 2 & 0x33333333) + (uVar10 & 0x33333333);
  uVar10 = ((uVar10 >> 4) + uVar10 & 0xf0f0f0f) * 0x1010101 >> 0x18;
  if (SVar3 != SHADER_TYPE_UNKNOWN) {
    FixedLinearAllocator::AddSpace<Diligent::ShaderResourceCacheVk>(&Allocator,1);
    FixedLinearAllocator::AddSpace<Diligent::ShaderVariableManagerVk>(&Allocator,(ulong)uVar10);
  }
  FixedLinearAllocator::AddSpace<Diligent::ImmutableSamplerAttribsVk>
            (&Allocator,(ulong)Desc->NumImmutableSamplers);
  if (CreateImmutableSamplers) {
    FixedLinearAllocator::AddSpace<Diligent::RefCntAutoPtr<Diligent::SamplerVkImpl>>
              (&Allocator,(ulong)Desc->NumImmutableSamplers);
  }
  FixedLinearAllocator::Reserve(&Allocator);
  Allocator.m_pAllocator = (IMemoryAllocator *)0x0;
  msg._M_string_length = (size_type)Allocator.m_pDataStart;
  msg._M_dataplus._M_p = (pointer)RawAllocator;
  std::__uniq_ptr_impl<void,_Diligent::STDDeleter<void,_Diligent::IMemoryAllocator>_>::operator=
            ((__uniq_ptr_impl<void,_Diligent::STDDeleter<void,_Diligent::IMemoryAllocator>_> *)
             &this->m_pRawMemory,
             (__uniq_ptr_impl<void,_Diligent::STDDeleter<void,_Diligent::IMemoryAllocator>_> *)&msg)
  ;
  std::unique_ptr<void,_Diligent::STDDeleter<void,_Diligent::IMemoryAllocator>_>::~unique_ptr
            ((unique_ptr<void,_Diligent::STDDeleter<void,_Diligent::IMemoryAllocator>_> *)&msg);
  ResourceOffsets = &this->m_ResourceOffsets;
  args_1 = (PipelineResourceSignatureBase<Diligent::EngineVkImplTraits> *)ResourceOffsets;
  CopyPipelineResourceSignatureDesc
            (&Allocator,Desc,
             &(this->
              super_DeviceObjectBase<Diligent::IPipelineResourceSignature,_Diligent::RenderDeviceVkImpl,_Diligent::PipelineResourceSignatureDesc>
              ).m_Desc,ResourceOffsets);
  if ((this->
      super_DeviceObjectBase<Diligent::IPipelineResourceSignature,_Diligent::RenderDeviceVkImpl,_Diligent::PipelineResourceSignatureDesc>
      ).m_Desc.NumResources != (uint)(this->m_ResourceOffsets)._M_elems[3]) {
    FormatString<char[26],char[88]>
              (&msg,(Diligent *)"Debug expression failed:\n",
               (char (*) [26])
               "m_ResourceOffsets[SHADER_RESOURCE_VARIABLE_TYPE_NUM_TYPES] == this->m_Desc.NumResources"
               ,(char (*) [88])args_1);
    args_1 = (PipelineResourceSignatureBase<Diligent::EngineVkImplTraits> *)0x33d;
    DebugAssertionFailed
              (msg._M_dataplus._M_p,"Initialize",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/include/PipelineResourceSignatureBase.hpp"
               ,0x33d);
    std::__cxx11::string::~string((string *)&msg);
  }
  uVar12 = 0;
  while (uVar14 = uVar12, uVar14 != 3) {
    uVar11 = (ulong)ResourceOffsets->_M_elems[uVar14];
    uVar2 = (this->m_ResourceOffsets)._M_elems[uVar14 + 1];
    lVar13 = uVar11 * 0x18 + 0x11;
    for (; uVar12 = uVar14 + 1, uVar11 < uVar2; uVar11 = uVar11 + 1) {
      if (uVar14 != *(byte *)((long)&((this->
                                      super_DeviceObjectBase<Diligent::IPipelineResourceSignature,_Diligent::RenderDeviceVkImpl,_Diligent::PipelineResourceSignatureDesc>
                                      ).m_Desc.Resources)->Name + lVar13)) {
        FormatString<char[29]>(&msg,(char (*) [29])"Unexpected resource var type");
        args_1 = (PipelineResourceSignatureBase<Diligent::EngineVkImplTraits> *)0x342;
        DebugAssertionFailed
                  (msg._M_dataplus._M_p,"Initialize",
                   "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/include/PipelineResourceSignatureBase.hpp"
                   ,0x342);
        std::__cxx11::string::~string((string *)&msg);
      }
      lVar13 = lVar13 + 0x18;
    }
  }
  if ((AllocResourceAttribs->super__Function_base)._M_manager == (_Manager_type)0x0) {
    pPVar4 = FixedLinearAllocator::Allocate<Diligent::PipelineResourceAttribsVk>
                       (&Allocator,(ulong)Desc->NumResources);
  }
  else {
    pPVar4 = std::function<Diligent::PipelineResourceAttribsVk_*(Diligent::FixedLinearAllocator_&)>
             ::operator()(AllocResourceAttribs,&Allocator);
  }
  this->m_pResourceAttribs = pPVar4;
  if (SVar3 != SHADER_TYPE_UNKNOWN) {
    msg._M_dataplus._M_p = msg._M_dataplus._M_p & 0xffffffffffffff00;
    _AllowedVarTypes =
         (_func_int **)
         FixedLinearAllocator::
         Construct<Diligent::ShaderResourceCacheVk,Diligent::ResourceCacheContentType>
                   (&Allocator,(ResourceCacheContentType *)&msg);
    this->m_pStaticResCache = (ShaderResourceCacheImplType *)_AllowedVarTypes;
    args_1 = (PipelineResourceSignatureBase<Diligent::EngineVkImplTraits> *)AllowedVarTypes;
    msg._M_dataplus._M_p = (pointer)this;
    pSVar5 = FixedLinearAllocator::
             ConstructArray<Diligent::ShaderVariableManagerVk,std::reference_wrapper<Diligent::PipelineResourceSignatureBase<Diligent::EngineVkImplTraits>>,std::reference_wrapper<Diligent::ShaderResourceCacheVk>>
                       (&Allocator,(ulong)uVar10,
                        (reference_wrapper<Diligent::PipelineResourceSignatureBase<Diligent::EngineVkImplTraits>_>
                         *)&msg,(reference_wrapper<Diligent::ShaderResourceCacheVk> *)args_1);
    this->m_StaticVarsMgrs = pSVar5;
  }
  if ((AllocImmutableSampler->super__Function_base)._M_manager == (_Manager_type)0x0) {
    pIVar6 = FixedLinearAllocator::ConstructArray<Diligent::ImmutableSamplerAttribsVk>
                       (&Allocator,(ulong)Desc->NumImmutableSamplers);
  }
  else {
    pIVar6 = (ImmutableSamplerAttribsVk *)
             std::function<void_*(Diligent::FixedLinearAllocator_&)>::operator()
                       (AllocImmutableSampler,&Allocator);
  }
  this->m_pImmutableSamplerAttribs = pIVar6;
  if (CreateImmutableSamplers) {
    pRVar7 = FixedLinearAllocator::ConstructArray<Diligent::RefCntAutoPtr<Diligent::SamplerVkImpl>>
                       (&Allocator,(ulong)Desc->NumImmutableSamplers);
    this->m_pImmutableSamplers = pRVar7;
    args_1 = this;
    if ((this->
        super_DeviceObjectBase<Diligent::IPipelineResourceSignature,_Diligent::RenderDeviceVkImpl,_Diligent::PipelineResourceSignatureDesc>
        ).m_pDevice != (RenderDeviceVkImpl *)0x0) {
      pRVar8 = DeviceObjectBase<Diligent::IPipelineResourceSignature,_Diligent::RenderDeviceVkImpl,_Diligent::PipelineResourceSignatureDesc>
               ::GetDevice(&this->
                            super_DeviceObjectBase<Diligent::IPipelineResourceSignature,_Diligent::RenderDeviceVkImpl,_Diligent::PipelineResourceSignatureDesc>
                          );
      lVar13 = 0x10;
      lVar15 = 0;
      for (uVar12 = 0; uVar12 < Desc->NumImmutableSamplers; uVar12 = uVar12 + 1) {
        plVar16 = (long *)((long)&this->m_pImmutableSamplers->m_pObject + lVar15);
        args_1 = (PipelineResourceSignatureBase<Diligent::EngineVkImplTraits> *)Desc;
        (**(code **)((long)(pRVar8->
                           super_RenderDeviceNextGenBase<Diligent::RenderDeviceBase<Diligent::EngineVkImplTraits>,_Diligent::ICommandQueueVk>
                           ).super_RenderDeviceBase<Diligent::EngineVkImplTraits>.
                           super_ObjectBase<Diligent::IRenderDeviceVk>.
                           super_RefCountedObject<Diligent::IRenderDeviceVk>.super_IRenderDeviceVk.
                           super_IRenderDevice.super_IObject + 0x38))
                  (pRVar8,(long)(Desc->ImmutableSamplers->Desc).BorderColor + lVar13 + -0x2c,plVar16
                  );
        if (*plVar16 == 0) {
          FormatString<char[26],char[9]>
                    (&msg,(Diligent *)"Debug expression failed:\n",(char (*) [26])"pSampler",
                     (char (*) [9])args_1);
          args_1 = (PipelineResourceSignatureBase<Diligent::EngineVkImplTraits> *)0x364;
          DebugAssertionFailed
                    (msg._M_dataplus._M_p,"Initialize",
                     "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/include/PipelineResourceSignatureBase.hpp"
                     ,0x364);
          std::__cxx11::string::~string((string *)&msg);
        }
        lVar15 = lVar15 + 8;
        lVar13 = lVar13 + 0x48;
      }
    }
  }
  std::function<void_()>::operator()(InitResourceLayout);
  if (SVar3 != SHADER_TYPE_UNKNOWN) {
    _AllowedVarTypes = _AllowedVarTypes & 0xffffffffffffff00;
    for (lVar13 = 0; lVar13 != 6; lVar13 = lVar13 + 1) {
      cVar1 = (this->m_StaticResStageIndex)._M_elems[lVar13];
      if (-1 < cVar1) {
        if (uVar10 <= (uint)(int)cVar1) {
          FormatString<char[26],char[46]>
                    (&msg,(Diligent *)"Debug expression failed:\n",
                     (char (*) [26])"static_cast<Uint32>(Idx) < NumStaticResStages",
                     (char (*) [46])args_1);
          DebugAssertionFailed
                    (msg._M_dataplus._M_p,"Initialize",
                     "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/include/PipelineResourceSignatureBase.hpp"
                     ,0x375);
          std::__cxx11::string::~string((string *)&msg);
        }
        SVar3 = GetShaderTypeFromPipelineIndex((Int32)lVar13,this->m_PipelineType);
        args_1 = (PipelineResourceSignatureBase<Diligent::EngineVkImplTraits> *)AllowedVarTypes;
        ShaderVariableManagerVk::Initialize
                  (this->m_StaticVarsMgrs + (int)cVar1,(PipelineResourceSignatureVkImpl *)this,
                   RawAllocator,AllowedVarTypes,1,SVar3);
      }
    }
  }
  if (1 < Desc->SRBAllocationGranularity) {
    msg.field_2._M_allocated_capacity = 0;
    msg.field_2._8_8_ = 0;
    msg._M_dataplus._M_p = (pointer)0x0;
    msg._M_string_length = 0;
    for (uVar12 = 0; uVar10 = this->m_ShaderStages - (this->m_ShaderStages >> 1 & 0x55555555),
        uVar10 = (uVar10 >> 2 & 0x33333333) + (uVar10 & 0x33333333),
        uVar12 < ((uVar10 >> 4) + uVar10 & 0xf0f0f0f) * 0x1010101 >> 0x18; uVar12 = uVar12 + 1) {
      _AllowedVarTypes = 0x201;
      SVar3 = GetActiveShaderStageType(this,(Uint32)uVar12);
      pcVar9 = (pointer)ShaderVariableManagerVk::GetRequiredMemorySize
                                  ((PipelineResourceSignatureVkImpl *)this,AllowedVarTypes,2,SVar3,
                                   (Uint32 *)0x0);
      (&msg._M_dataplus)[uVar12]._M_p = pcVar9;
    }
    _AllowedVarTypes =
         (_func_int **)
         std::function<unsigned_long_()>::operator()(GetRequiredResourceCacheMemorySize);
    uVar10 = this->m_ShaderStages - (this->m_ShaderStages >> 1 & 0x55555555);
    uVar10 = (uVar10 >> 2 & 0x33333333) + (uVar10 & 0x33333333);
    SRBMemoryAllocator::Initialize
              (&this->m_SRBMemAllocator,Desc->SRBAllocationGranularity,
               ((uVar10 >> 4) + uVar10 & 0xf0f0f0f) * 0x1010101 >> 0x18,(size_t *)&msg,1,
               (size_t *)AllowedVarTypes);
  }
  CalculateHash(this);
  FixedLinearAllocator::~FixedLinearAllocator(&Allocator);
  return;
}

Assistant:

void Initialize(IMemoryAllocator&                               RawAllocator,
                    const PipelineResourceSignatureDesc&            Desc,
                    bool                                            CreateImmutableSamplers,
                    const std::function<void()>&                    InitResourceLayout,
                    const std::function<size_t()>&                  GetRequiredResourceCacheMemorySize,
                    const AllocResourceAttribsCallbackType&         AllocResourceAttribs  = nullptr,
                    const AllocImmutableSamplerAttribsCallbackType& AllocImmutableSampler = nullptr) noexcept(false)
    {
        FixedLinearAllocator Allocator{RawAllocator};

        ReserveSpaceForPipelineResourceSignatureDesc(Allocator, Desc);

        Allocator.AddSpace<PipelineResourceAttribsType>(Desc.NumResources);

        const Uint32 NumStaticResStages = GetNumStaticResStages();
        if (NumStaticResStages > 0)
        {
            Allocator.AddSpace<ShaderResourceCacheImplType>(1);
            Allocator.AddSpace<ShaderVariableManagerImplType>(NumStaticResStages);
        }

        Allocator.AddSpace<ImmutableSamplerAttribsType>(Desc.NumImmutableSamplers);
        if (CreateImmutableSamplers)
        {
            Allocator.AddSpace<RefCntAutoPtr<SamplerImplType>>(Desc.NumImmutableSamplers);
        }

        Allocator.Reserve();
        // The memory is now owned by PipelineResourceSignatureBase and will be freed by Destruct().
        m_pRawMemory = decltype(m_pRawMemory){Allocator.ReleaseOwnership(), STDDeleterRawMem<void>{RawAllocator}};

        CopyPipelineResourceSignatureDesc(Allocator, Desc, this->m_Desc, m_ResourceOffsets);

#ifdef DILIGENT_DEBUG
        VERIFY_EXPR(m_ResourceOffsets[SHADER_RESOURCE_VARIABLE_TYPE_NUM_TYPES] == this->m_Desc.NumResources);
        for (Uint32 VarType = 0; VarType < SHADER_RESOURCE_VARIABLE_TYPE_NUM_TYPES; ++VarType)
        {
            const auto IdxRange = GetResourceIndexRange(static_cast<SHADER_RESOURCE_VARIABLE_TYPE>(VarType));
            for (Uint32 idx = IdxRange.first; idx < IdxRange.second; ++idx)
                VERIFY(this->m_Desc.Resources[idx].VarType == VarType, "Unexpected resource var type");
        }
#endif

        // Objects will be constructed by the specific implementation
        static_assert(std::is_trivially_destructible<PipelineResourceAttribsType>::value,
                      "PipelineResourceAttribsType objects must be constructed to be properly destructed in case an exception is thrown");
        m_pResourceAttribs = AllocResourceAttribs ?
            AllocResourceAttribs(Allocator) :
            Allocator.Allocate<PipelineResourceAttribsType>(Desc.NumResources);

        if (NumStaticResStages > 0)
        {
            m_pStaticResCache = Allocator.Construct<ShaderResourceCacheImplType>(ResourceCacheContentType::Signature);

            static_assert(std::is_nothrow_constructible<ShaderVariableManagerImplType, decltype(*this), ShaderResourceCacheImplType&>::value,
                          "Constructor of ShaderVariableManagerImplType must be noexcept, so we can safely construct all manager objects");
            m_StaticVarsMgrs = Allocator.ConstructArray<ShaderVariableManagerImplType>(NumStaticResStages, std::ref(*this), std::ref(*m_pStaticResCache));
        }

        m_pImmutableSamplerAttribs = AllocImmutableSampler ?
            static_cast<ImmutableSamplerAttribsType*>(AllocImmutableSampler(Allocator)) :
            Allocator.ConstructArray<ImmutableSamplerAttribsType>(Desc.NumImmutableSamplers);
        if (CreateImmutableSamplers)
        {
            m_pImmutableSamplers = Allocator.ConstructArray<RefCntAutoPtr<SamplerImplType>>(Desc.NumImmutableSamplers);
            if (this->HasDevice())
            {
                IRenderDevice* pDevice = this->GetDevice();
                for (Uint32 s = 0; s < Desc.NumImmutableSamplers; ++s)
                {
                    const ImmutableSamplerDesc&     ImtblSamDesc = Desc.ImmutableSamplers[s];
                    RefCntAutoPtr<SamplerImplType>& pSampler     = m_pImmutableSamplers[s];
                    pDevice->CreateSampler(ImtblSamDesc.Desc, pSampler.template RawDblPtr<ISampler>());
                    VERIFY_EXPR(pSampler);
                }
            }
        }

        InitResourceLayout();

        PipelineResourceSignatureImplType* const pThisImpl = static_cast<PipelineResourceSignatureImplType*>(this);

        if (NumStaticResStages > 0)
        {
            constexpr SHADER_RESOURCE_VARIABLE_TYPE AllowedVarTypes[] = {SHADER_RESOURCE_VARIABLE_TYPE_STATIC};
            for (Uint32 i = 0; i < m_StaticResStageIndex.size(); ++i)
            {
                Int8 Idx = m_StaticResStageIndex[i];
                if (Idx >= 0)
                {
                    VERIFY_EXPR(static_cast<Uint32>(Idx) < NumStaticResStages);
                    const SHADER_TYPE ShaderType = GetShaderTypeFromPipelineIndex(i, GetPipelineType());
                    m_StaticVarsMgrs[Idx].Initialize(*pThisImpl, RawAllocator, AllowedVarTypes, _countof(AllowedVarTypes), ShaderType);
                }
            }
        }

        if (Desc.SRBAllocationGranularity > 1)
        {
            std::array<size_t, MAX_SHADERS_IN_PIPELINE> ShaderVariableDataSizes = {};
            for (Uint32 s = 0; s < GetNumActiveShaderStages(); ++s)
            {
                constexpr SHADER_RESOURCE_VARIABLE_TYPE AllowedVarTypes[]{SHADER_RESOURCE_VARIABLE_TYPE_MUTABLE, SHADER_RESOURCE_VARIABLE_TYPE_DYNAMIC};
                ShaderVariableDataSizes[s] = ShaderVariableManagerImplType::GetRequiredMemorySize(*pThisImpl, AllowedVarTypes, _countof(AllowedVarTypes), GetActiveShaderStageType(s));
            }

            const size_t CacheMemorySize = GetRequiredResourceCacheMemorySize();
            m_SRBMemAllocator.Initialize(Desc.SRBAllocationGranularity, GetNumActiveShaderStages(), ShaderVariableDataSizes.data(), 1, &CacheMemorySize);
        }

        pThisImpl->CalculateHash();
    }